

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O2

void __thiscall undo::UndoHistory::undo(UndoHistory *this)

{
  UndoState *pUVar1;
  uint __line;
  UndoState *new_state;
  char *__assertion;
  
  pUVar1 = this->m_cur;
  if (pUVar1 == (UndoState *)0x0) {
    __assertion = "m_cur";
    __line = 0x2d;
  }
  else {
    new_state = pUVar1->m_prev;
    if (pUVar1 == this->m_first) {
      if (new_state == (UndoState *)0x0) {
        new_state = (UndoState *)0x0;
        goto LAB_001020d7;
      }
    }
    else if (new_state != (UndoState *)0x0) {
LAB_001020d7:
      moveTo(this,new_state);
      return;
    }
    __assertion = "(m_cur != m_first && m_cur->m_prev) || (m_cur == m_first && !m_cur->m_prev)";
    __line = 0x33;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp",
                __line,"void undo::UndoHistory::undo()");
}

Assistant:

void UndoHistory::undo()
{
  assert(m_cur);
  if (!m_cur)
    return;

  assert(
    (m_cur != m_first && m_cur->m_prev) ||
    (m_cur == m_first && !m_cur->m_prev));

  moveTo(m_cur->m_prev);
}